

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

Bool ShouldIndent(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  Dict *pDVar2;
  Bool BVar3;
  Bool BVar4;
  Node *node_00;
  
  if ((int)doc == 0) {
    return no;
  }
  if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_TEXTAREA)) {
    return no;
  }
  if ((int)doc == 2) {
    if ((node->content != (Node *)0x0) && (BVar3 = prvTidynodeHasCM(node,0x40000), BVar3 != no)) {
      node_00 = node->content;
      while( true ) {
        if (node_00 == (Node *)0x0) {
          return no;
        }
        BVar3 = prvTidynodeHasCM(node_00,8);
        if (BVar3 != no) break;
        node_00 = node_00->next;
      }
      return yes;
    }
    BVar3 = prvTidynodeHasCM(node,0x4000);
    if (BVar3 != no) {
      return no;
    }
    if (node->tag != (Dict *)0x0) {
      TVar1 = node->tag->id;
      if ((int)TVar1 < 0x50) {
        if (TVar1 == TidyTag_DIV) {
          if (((node->last != (Node *)0x0) && (pDVar2 = node->last->tag, pDVar2 != (Dict *)0x0)) &&
             (pDVar2->id == TidyTag_IMG)) {
            return no;
          }
        }
        else if (TVar1 == TidyTag_HTML) {
          return no;
        }
      }
      else {
        if (TVar1 == TidyTag_P) {
          return no;
        }
        if (TVar1 == TidyTag_TITLE) {
          return no;
        }
      }
    }
  }
  BVar3 = prvTidynodeHasCM(node,0xc00);
  BVar4 = yes;
  if ((BVar3 == no) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_MAP)))) {
    BVar3 = prvTidynodeHasCM(node,0x10);
    BVar4 = no;
    if (BVar3 == no) {
      BVar4 = (Bool)(node->content != (Node *)0x0);
    }
  }
  return BVar4;
}

Assistant:

static Bool ShouldIndent( TidyDocImpl* doc, Node *node )
{
    TidyTriState indentContent = cfgAutoBool( doc, TidyIndentContent );
    if ( indentContent == TidyNoState )
        return no;

    if ( nodeIsTEXTAREA(node) )
        return no;

    if ( indentContent == TidyAutoState )
    {
        if ( node->content && TY_(nodeHasCM)(node, CM_NO_INDENT) )
        {
            for ( node = node->content; node; node = node->next )
                if ( TY_(nodeHasCM)(node, CM_BLOCK) )
                    return yes;
            return no;
        }

        if ( TY_(nodeHasCM)(node, CM_HEADING) )
            return no;

        if ( nodeIsHTML(node) )
            return no;

        if ( nodeIsP(node) )
            return no;

        if ( nodeIsTITLE(node) )
            return no;

        /* http://tidy.sf.net/issue/1610888
           Indenting <div><img /></div> produces spurious lines with IE 6.x */
        if ( nodeIsDIV(node) && node->last && nodeIsIMG(node->last) )
            return no;
    }

    if ( TY_(nodeHasCM)(node, CM_FIELD | CM_OBJECT) )
        return yes;

    if ( nodeIsMAP(node) )
        return yes;

    return ( !TY_(nodeHasCM)( node, CM_INLINE ) && node->content );
}